

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

int Dsd_TreeCollectDecomposableVars_rec(DdManager *dd,Dsd_Node_t *pNode,int *pVars,int *nVars)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int fVerbose;
  Dsd_Node_t *pTemp;
  int i;
  int fSkipThisNode;
  int *nVars_local;
  int *pVars_local;
  Dsd_Node_t *pNode_local;
  DdManager *dd_local;
  
  if (pNode == (Dsd_Node_t *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/dsd/dsdTree.c"
                  ,500,
                  "int Dsd_TreeCollectDecomposableVars_rec(DdManager *, Dsd_Node_t *, int *, int *)"
                 );
  }
  if (((ulong)pNode & 1) == 0) {
    if (pNode->nDecs < 2) {
      dd_local._4_4_ = 0;
    }
    else {
      pTemp._4_4_ = 0;
      for (pTemp._0_4_ = 0; (int)pTemp < pNode->nDecs; pTemp._0_4_ = (int)pTemp + 1) {
        iVar2 = Dsd_TreeCollectDecomposableVars_rec
                          (dd,(Dsd_Node_t *)((ulong)pNode->pDecs[(int)pTemp] & 0xfffffffffffffffe),
                           pVars,nVars);
        if (iVar2 != 0) {
          pTemp._4_4_ = 1;
        }
      }
      if ((pTemp._4_4_ == 0) &&
         (((pNode->Type == DSD_NODE_OR || (pNode->Type == DSD_NODE_EXOR)) || (pNode->nDecs < 5)))) {
        for (pTemp._0_4_ = 0; (int)pTemp < pNode->nDecs; pTemp._0_4_ = (int)pTemp + 1) {
          piVar3 = (int *)((ulong)pNode->pDecs[(int)pTemp] & 0xfffffffffffffffe);
          if (*piVar3 == 2) {
            if (pVars == (int *)0x0) {
              *nVars = *nVars + 1;
            }
            else {
              iVar2 = **(int **)(piVar3 + 4);
              iVar1 = *nVars;
              *nVars = iVar1 + 1;
              pVars[iVar1] = iVar2;
            }
          }
        }
      }
      else {
        pTemp._4_4_ = 1;
      }
      dd_local._4_4_ = pTemp._4_4_;
    }
    return dd_local._4_4_;
  }
  __assert_fail("!Dsd_IsComplement( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/dsd/dsdTree.c"
                ,0x1f5,
                "int Dsd_TreeCollectDecomposableVars_rec(DdManager *, Dsd_Node_t *, int *, int *)");
}

Assistant:

int Dsd_TreeCollectDecomposableVars_rec( DdManager * dd, Dsd_Node_t * pNode, int * pVars, int * nVars )
{
    int fSkipThisNode, i;
    Dsd_Node_t * pTemp;
    int fVerbose = 0;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );

    if ( pNode->nDecs <= 1 )
        return 0;

    // go through the list of successors and call recursively 
    fSkipThisNode = 0;
    for ( i = 0; i < pNode->nDecs; i++ )
        if ( Dsd_TreeCollectDecomposableVars_rec(dd, Dsd_Regular(pNode->pDecs[i]), pVars, nVars) )
            fSkipThisNode = 1;

    if ( !fSkipThisNode && (pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR || pNode->nDecs <= 4) )
    {
if ( fVerbose )
printf( "Node of type <%d> (OR=6,EXOR=8,RAND=1): ", pNode->Type );

        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pTemp = Dsd_Regular(pNode->pDecs[i]);
            if ( pTemp->Type == DSD_NODE_BUF )
            {
                if ( pVars )
                    pVars[ (*nVars)++ ] = pTemp->S->index;
                else
                    (*nVars)++;
                    
if ( fVerbose )
printf( "%d ", pTemp->S->index );
            }
        }
if ( fVerbose )
printf( "\n" );
    }
    else
        fSkipThisNode = 1;


    return fSkipThisNode;
}